

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

int __thiscall
icu_63::RuleBasedCollator::clone
          (RuleBasedCollator *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RuleBasedCollator *this_00;
  
  this_00 = (RuleBasedCollator *)UMemory::operator_new((UMemory *)0x110,(size_t)__fn);
  if (this_00 != (RuleBasedCollator *)0x0) {
    RuleBasedCollator(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Collator *
RuleBasedCollator::clone() const {
    return new RuleBasedCollator(*this);
}